

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_msh(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  REF_CELL_TYPE RVar7;
  FILE *__stream;
  REF_CELL *ppRVar8;
  long lVar9;
  undefined8 uVar10;
  REF_GLOB n_global;
  char *pcVar11;
  long lVar12;
  REF_CELL *ppRVar13;
  int *piVar14;
  REF_INT n1;
  REF_INT n0;
  REF_INT n2;
  int n;
  int datasize;
  int filetype;
  REF_INT ntri;
  REF_INT id;
  REF_INT nnode;
  double version;
  int parameric;
  REF_INT new_cell;
  REF_INT new_node;
  REF_INT type;
  REF_INT nedge;
  REF_DBL y;
  REF_DBL x;
  int node_tag;
  int entity_tag;
  int entity_dim;
  REF_INT nelem;
  REF_INT dim;
  REF_DBL z;
  REF_INT dummy;
  char line [1024];
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  uint local_584;
  uint local_580;
  int local_57c;
  int local_578;
  uint local_574;
  uint local_570;
  undefined4 uStack_56c;
  uint local_568;
  REF_INT local_564;
  int local_560;
  int local_55c;
  uint local_558;
  int local_554;
  long local_550;
  REF_CELL *local_548;
  REF_DBL local_540;
  REF_DBL local_538;
  int local_530;
  undefined1 local_52c [4];
  undefined1 local_528 [4];
  undefined1 local_524 [4];
  uint local_520;
  int local_51c;
  REF_CELL *local_518;
  REF_CELL *local_510;
  int local_508;
  undefined8 local_504;
  int local_4fc;
  int iStack_4f8;
  undefined8 local_4e8;
  REF_CELL *local_490;
  REF_CELL *local_488;
  REF_CELL *local_480;
  REF_CELL *local_478;
  REF_CELL *local_470;
  REF_CELL *local_468;
  REF_CELL *local_460;
  REF_CELL *local_458;
  REF_CELL *local_450;
  REF_DBL local_448;
  undefined1 local_43c [4];
  undefined4 local_438;
  short sStack_434;
  undefined1 uStack_432;
  undefined1 uStack_431;
  char local_430;
  undefined1 uStack_42f;
  undefined2 uStack_42e;
  undefined3 uStack_42c;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x3e6,"ref_import_msh","unable to open file");
      uVar3 = 2;
    }
    else {
      iVar4 = feof(__stream);
      if (iVar4 == 0) {
        ppRVar13 = pRVar1->cell;
        local_510 = pRVar1->cell + 3;
        local_518 = pRVar1->cell + 6;
        local_450 = pRVar1->cell + 2;
        local_458 = pRVar1->cell + 5;
        local_460 = pRVar1->cell + 0xc;
        local_468 = pRVar1->cell + 4;
        local_470 = pRVar1->cell + 1;
        local_478 = pRVar1->cell + 9;
        local_480 = pRVar1->cell + 10;
        local_488 = pRVar1->cell + 0xb;
        local_490 = pRVar1->cell + 8;
        do {
          iVar4 = __isoc99_fscanf(__stream,"%s",&local_438);
          if (iVar4 != 1) {
            if (iVar4 == -1) {
              return 0;
            }
            lVar12 = (long)iVar4;
            pcVar11 = "line read failed";
            lVar9 = 1;
            uVar10 = 0x3eb;
            goto LAB_0015c855;
          }
          if (CONCAT11(uStack_42f,local_430) == 0x6e &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x6f69736e656d6944) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_51c);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "read dim";
              lVar9 = 1;
              uVar10 = 0x3f0;
              goto LAB_0015c855;
            }
            if (local_51c == 2) {
              pRVar1->twod = 1;
            }
          }
          if (local_430 == '\0' &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x7365636974726556) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_574);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "read nnode";
              lVar9 = 1;
              uVar10 = 0x3f5;
              goto LAB_0015c855;
            }
            n_global = (REF_GLOB)(int)local_574;
            if (0 < n_global) {
              lVar12 = 0;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%lf %lf %d",&local_538,&local_540,local_43c);
                if (iVar4 != 3) {
                  lVar12 = (long)iVar4;
                  pcVar11 = "read xy";
                  lVar9 = 3;
                  uVar10 = 0x3f7;
                  goto LAB_0015c855;
                }
                uVar3 = ref_node_add(ref_node,lVar12,&local_55c);
                if (uVar3 != 0) {
                  pcVar11 = "add node";
                  uVar10 = 0x3f8;
                  goto LAB_0015b827;
                }
                pRVar2 = ref_node->real;
                lVar9 = (long)local_55c;
                pRVar2[lVar9 * 0xf] = local_538;
                pRVar2[lVar9 * 0xf + 1] = local_540;
                pRVar2[lVar9 * 0xf + 2] = 0.0;
                lVar12 = lVar12 + 1;
                n_global = (REF_GLOB)(int)local_574;
              } while (lVar12 < n_global);
            }
            uVar3 = ref_node_initialize_n_global(ref_node,n_global);
            if (uVar3 != 0) {
              pcVar11 = "init glob";
              uVar10 = 0x3fd;
              goto LAB_0015b827;
            }
          }
          if (sStack_434 == 0x73 && local_438 == 0x65676445) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_554);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "read nedge";
              lVar9 = 1;
              uVar10 = 0x401;
              goto LAB_0015c855;
            }
            if (0 < local_554) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d",&local_590,&local_594,&local_578);
                if (iVar6 != 3) {
                  lVar12 = (long)iVar6;
                  pcVar11 = "read edge";
                  lVar9 = 3;
                  uVar10 = 0x403;
                  goto LAB_0015c855;
                }
                local_590 = local_590 + -1;
                local_594 = local_594 + -1;
                local_504 = CONCAT44(local_578,local_594);
                local_508 = local_590;
                uVar3 = ref_cell_add(*ppRVar13,&local_508,&local_564);
                if (uVar3 != 0) {
                  pcVar11 = "quad face for an edge";
                  uVar10 = 0x40a;
                  goto LAB_0015b827;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_554);
            }
          }
          if (CONCAT11(uStack_42f,local_430) == 0x73 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x656c676e61697254) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_57c);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "read ntri";
              lVar9 = 1;
              uVar10 = 0x40f;
              goto LAB_0015c855;
            }
            if (0 < local_57c) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_590,&local_594,&local_58c,
                                        &local_578);
                if (iVar6 != 4) {
                  lVar12 = (long)iVar6;
                  pcVar11 = "read tri";
                  lVar9 = 4;
                  uVar10 = 0x411;
                  goto LAB_0015c855;
                }
                local_590 = local_590 + -1;
                local_594 = local_594 + -1;
                local_58c = local_58c + -1;
                local_504 = CONCAT44(local_58c,local_594);
                local_4fc = local_578;
                local_508 = local_590;
                uVar3 = ref_cell_add(*local_510,&local_508,&local_564);
                if (uVar3 != 0) {
                  pcVar11 = "tri face for tri";
                  uVar10 = 0x41a;
                  goto LAB_0015b827;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_57c);
            }
          }
          if (CONCAT35(uStack_42c,
                       CONCAT23(uStack_42e,CONCAT12(uStack_42f,CONCAT11(local_430,uStack_431)))) ==
              0x736c6172657461 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x616c697264617551) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_57c);
            if (iVar4 != 1) {
              lVar12 = (long)iVar4;
              pcVar11 = "read ntri";
              lVar9 = 1;
              uVar10 = 0x41f;
              goto LAB_0015c855;
            }
            if (0 < local_57c) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d %d",&local_590,&local_594,&local_58c,
                                        &local_560,&local_578);
                if (iVar6 != 5) {
                  lVar12 = (long)iVar6;
                  pcVar11 = "read quad";
                  lVar9 = 5;
                  uVar10 = 0x422;
                  goto LAB_0015c855;
                }
                local_590 = local_590 + -1;
                local_594 = local_594 + -1;
                local_58c = local_58c + -1;
                local_560 = local_560 + -1;
                local_504 = CONCAT44(local_58c,local_594);
                iStack_4f8 = local_578;
                local_508 = local_590;
                local_4fc = local_560;
                uVar3 = ref_cell_add(*local_518,&local_508,&local_564);
                if (uVar3 != 0) {
                  pcVar11 = "qua face for qua";
                  uVar10 = 0x42d;
                  goto LAB_0015b827;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_57c);
            }
          }
          if (CONCAT22(uStack_42e,CONCAT11(uStack_42f,local_430)) == 0x74616d &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x726f466873654d24) {
            iVar4 = __isoc99_fscanf(__stream,"%lf %d %d",&local_570,&local_580,&local_584);
            if (iVar4 != 3) {
              lVar12 = (long)iVar4;
              pcVar11 = "read version file-type data-size";
              lVar9 = 3;
              uVar10 = 0x435;
              goto LAB_0015c855;
            }
            lVar12 = (long)(int)local_580;
            if (lVar12 != 0) {
              pcVar11 = "only ASCII implemented";
              uVar10 = 0x436;
              lVar9 = 0;
              goto LAB_0015c855;
            }
            lVar12 = (long)(int)local_584;
            if (lVar12 != 8) {
              pcVar11 = "only doubles implemented";
              lVar9 = 8;
              uVar10 = 0x437;
              goto LAB_0015c855;
            }
            printf("$MeshFormat %3.1f\n",CONCAT44(uStack_56c,local_570));
          }
          if (CONCAT13(uStack_432,CONCAT21(sStack_434,local_438._3_1_)) == 0x736564 &&
              local_438 == 0x646f4e24) {
            iVar4 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_570,&local_574,&local_580,
                                    &local_584);
            if (iVar4 != 4) {
              lVar12 = (long)iVar4;
              pcVar11 = "n entity bloc, nnode, min/max tag";
              lVar9 = 4;
              uVar10 = 0x440;
              goto LAB_0015c855;
            }
            local_548 = ppRVar13;
            printf("$Nodes\n%d %d %d %d\n",(ulong)local_570,(ulong)local_574,(ulong)local_580,
                   (ulong)local_584);
            if ((int)local_570 < 1) {
              lVar12 = 0;
            }
            else {
              iVar4 = 0;
              lVar12 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d",local_524,local_528,&local_568,
                                        &local_588);
                if (iVar6 != 4) {
                  lVar12 = (long)iVar6;
                  pcVar11 = 
                  "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) maxNodeTag(size_t)";
                  lVar9 = 4;
                  uVar10 = 0x449;
                  goto LAB_0015c855;
                }
                if (0 < local_588) {
                  iVar6 = 0;
                  local_550 = lVar12;
                  do {
                    iVar5 = __isoc99_fscanf(__stream,"%d",local_52c);
                    if (iVar5 != 1) {
                      lVar12 = (long)iVar5;
                      pcVar11 = "node tag";
                      lVar9 = 1;
                      uVar10 = 0x44c;
                      goto LAB_0015c855;
                    }
                    iVar6 = iVar6 + 1;
                  } while (iVar6 < local_588);
                  lVar12 = local_550;
                  if (0 < local_588) {
                    lVar12 = 0;
                    do {
                      lVar9 = local_550;
                      iVar6 = __isoc99_fscanf(__stream,"%lf %lf %lf",&local_538,&local_540,
                                              &local_448);
                      if (iVar6 != 3) {
                        lVar12 = (long)iVar6;
                        pcVar11 = "node tag";
                        lVar9 = 3;
                        uVar10 = 0x44f;
                        goto LAB_0015c855;
                      }
                      uVar3 = ref_node_add(ref_node,lVar9 + lVar12,&local_55c);
                      if (uVar3 != 0) {
                        pcVar11 = "add node";
                        uVar10 = 0x450;
                        goto LAB_0015b827;
                      }
                      pRVar2 = ref_node->real;
                      lVar9 = (long)local_55c;
                      pRVar2[lVar9 * 0xf] = local_538;
                      pRVar2[lVar9 * 0xf + 1] = local_540;
                      pRVar2[lVar9 * 0xf + 2] = local_448;
                      lVar12 = lVar12 + 1;
                    } while ((int)lVar12 < local_588);
                    lVar12 = local_550 + lVar12;
                  }
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < (int)local_570);
            }
            ppRVar13 = local_548;
            lVar9 = (long)(int)local_574;
            if (lVar12 != lVar9) {
              pcVar11 = "node count";
              uVar10 = 0x457;
              goto LAB_0015c855;
            }
            uVar3 = ref_node_initialize_n_global(ref_node,lVar12);
            if (uVar3 != 0) {
              pcVar11 = "init glob";
              uVar10 = 0x458;
              goto LAB_0015b827;
            }
          }
          if (CONCAT11(uStack_42f,local_430) == 0x73 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x746e656d656c4524) {
            iVar4 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_570,&local_520,&local_580,
                                    &local_584);
            if (iVar4 != 4) {
              lVar12 = (long)iVar4;
              pcVar11 = "n entity bloc, nnode, min/max tag";
              lVar9 = 4;
              uVar10 = 0x45e;
LAB_0015c855:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,uVar10,"ref_import_msh",pcVar11,lVar9,lVar12);
              return 1;
            }
            printf("$Elements\n%d %d %d %d\n",(ulong)local_570,(ulong)local_520,(ulong)local_580,
                   (ulong)local_584);
            if (0 < (int)local_570) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d",local_524,local_528,&local_558,
                                        &local_568);
                if (iVar6 != 4) {
                  lVar12 = (long)iVar6;
                  pcVar11 = 
                  "entityDim(int) entityTag(int) elementType(int) numElementsInBlock(size_t)";
                  lVar9 = 4;
                  uVar10 = 0x466;
                  goto LAB_0015c855;
                }
                local_530 = iVar4;
                printf("element bloc %d of %d\n",(ulong)local_568,(ulong)local_558);
                ppRVar8 = ppRVar13;
                switch(local_558) {
                case 1:
                  break;
                case 2:
                  ppRVar8 = local_510;
                  break;
                case 3:
                  ppRVar8 = local_518;
                  break;
                case 4:
                  ppRVar8 = local_490;
                  break;
                case 5:
                  ppRVar8 = local_488;
                  break;
                case 6:
                  ppRVar8 = local_480;
                  break;
                case 7:
                  ppRVar8 = local_478;
                  break;
                case 8:
                  ppRVar8 = local_470;
                  break;
                case 9:
                  ppRVar8 = local_468;
                  break;
                default:
                  printf("type = %d\n");
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x48f,"ref_import_msh","unknown $Elements type");
                  return 1;
                case 0xb:
                  ppRVar8 = local_460;
                  break;
                case 0x15:
                  ppRVar8 = local_458;
                  break;
                case 0x1a:
                  ppRVar8 = local_450;
                }
                if (0 < (int)local_568) {
                  ref_cell = *ppRVar8;
                  iVar4 = 0;
                  local_548 = ppRVar13;
                  do {
                    local_550 = CONCAT44(local_550._4_4_,iVar4);
                    iVar4 = __isoc99_fscanf(__stream,"%d",&local_588);
                    if (iVar4 != 1) {
                      lVar12 = (long)iVar4;
                      pcVar11 = "elementTag(size_t)";
                      lVar9 = 1;
                      uVar10 = 0x493;
                      goto LAB_0015c855;
                    }
                    iVar4 = ref_cell->node_per;
                    if (0 < iVar4) {
                      piVar14 = &local_508;
                      lVar12 = 0;
                      do {
                        iVar4 = __isoc99_fscanf(__stream,"%d",piVar14);
                        if (iVar4 != 1) {
                          lVar12 = (long)iVar4;
                          pcVar11 = "nodeTag(size_t)";
                          lVar9 = 1;
                          uVar10 = 0x495;
                          goto LAB_0015c855;
                        }
                        *piVar14 = *piVar14 + -1;
                        lVar12 = lVar12 + 1;
                        iVar4 = ref_cell->node_per;
                        piVar14 = piVar14 + 1;
                        ppRVar13 = local_548;
                      } while (lVar12 < iVar4);
                    }
                    if (ref_cell->last_node_is_an_id != 0) {
                      (&local_508)[iVar4] = local_588;
                    }
                    RVar7 = ref_cell->type;
                    if (RVar7 == REF_CELL_PYR) {
                      local_590 = local_508;
                      local_594 = (int)local_504;
                      local_58c = local_504._4_4_;
                      uVar10 = CONCAT44(iStack_4f8,local_4fc);
                      local_560 = local_4fc;
                      local_4fc = (int)local_504;
                      iStack_4f8 = local_504._4_4_;
                      RVar7 = ref_cell->type;
                      local_504 = uVar10;
                    }
                    if (RVar7 == REF_CELL_TE2) {
                      local_4e8 = CONCAT44((int)local_4e8,(int)((ulong)local_4e8 >> 0x20));
                    }
                    uVar3 = ref_cell_add(ref_cell,&local_508,&local_564);
                    if (uVar3 != 0) {
                      pcVar11 = "add $Element";
                      uVar10 = 0x4ab;
                      goto LAB_0015b827;
                    }
                    iVar4 = (int)local_550 + 1;
                  } while (iVar4 < (int)local_568);
                }
                iVar4 = local_530 + 1;
              } while (iVar4 < (int)local_570);
            }
          }
          iVar4 = feof(__stream);
        } while (iVar4 == 0);
      }
      fclose(__stream);
      uVar3 = 6;
    }
  }
  else {
    pcVar11 = "create grid";
    uVar10 = 0x3e0;
LAB_0015b827:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar10
           ,"ref_import_msh",(ulong)uVar3,pcVar11);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_msh(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char line[1024];
  REF_INT dummy;
  REF_DBL x, y, z;
  REF_INT dim, nnode, node, new_node;
  REF_INT nedge, edge, n0, n1, n2, n3, n4, n9, id;
  REF_INT ntri, tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  REF_INT status;
  REF_INT nelem, type;
  REF_BOOL verbose = REF_TRUE;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  while (!feof(file)) {
    status = fscanf(file, "%s", line);
    if (EOF == status) return REF_SUCCESS;
    REIS(1, status, "line read failed");

    /* keywords without a leading $ are for BAMG */

    if (0 == strcmp("Dimension", line)) {
      REIS(1, fscanf(file, "%d", &dim), "read dim");
      if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;
    }

    if (0 == strcmp("Vertices", line)) {
      REIS(1, fscanf(file, "%d", &nnode), "read nnode");
      for (node = 0; node < nnode; node++) {
        REIS(3, fscanf(file, "%lf %lf %d", &x, &y, &dummy), "read xy");
        RSS(ref_node_add(ref_node, node, &new_node), "add node");
        ref_node_xyz(ref_node, 0, new_node) = x;
        ref_node_xyz(ref_node, 1, new_node) = y;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
      }
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("Edges", line)) {
      REIS(1, fscanf(file, "%d", &nedge), "read nedge");
      for (edge = 0; edge < nedge; edge++) {
        REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &id), "read edge");
        n0--;
        n1--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "quad face for an edge");
      }
    }

    if (0 == strcmp("Triangles", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &id), "read tri");
        n0--;
        n1--;
        n2--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = id;
        RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri face for tri");
      }
    }

    if (0 == strcmp("Quadrilaterals", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(5, fscanf(file, "%d %d %d %d %d", &n0, &n1, &n2, &n3, &id),
             "read quad");
        n0--;
        n1--;
        n2--;
        n3--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = n3;
        nodes[4] = id;
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
            "qua face for qua");
      }
    }

    if (0 == strcmp("$MeshFormat", line)) {
      double version;
      int filetype, datasize;
      REIS(3, fscanf(file, "%lf %d %d", &version, &filetype, &datasize),
           "read version file-type data-size");
      REIS(0, filetype, "only ASCII implemented")
      REIS(8, datasize, "only doubles implemented")
      if (verbose) printf("$MeshFormat %3.1f\n", version);
    }

    if (0 == strcmp("$Nodes", line)) {
      int bloc, nbloc, mintag, maxtag;
      REF_GLOB global;
      global = 0;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nnode, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Nodes\n%d %d %d %d\n", nbloc, nnode, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, parameric, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &parameric,
                    &n),
             "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) "
             "maxNodeTag(size_t)");
        for (i = 0; i < n; i++) {
          int node_tag;
          REIS(1, fscanf(file, "%d", &node_tag), "node tag");
        }
        for (i = 0; i < n; i++) {
          REIS(3, fscanf(file, "%lf %lf %lf", &x, &y, &z), "node tag");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          global++;
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      REIS(nnode, global, "node count");
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("$Elements", line)) {
      int bloc, nbloc, mintag, maxtag;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nelem, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Elements\n%d %d %d %d\n", nbloc, nelem, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &type, &n),
             "entityDim(int) entityTag(int) elementType(int) "
             "numElementsInBlock(size_t)");
        if (verbose) printf("element bloc %d of %d\n", n, type);
        switch (type) {
          case 1:
            ref_cell = ref_grid_edg(ref_grid);
            break;
          case 2:
            ref_cell = ref_grid_tri(ref_grid);
            break;
          case 3:
            ref_cell = ref_grid_qua(ref_grid);
            break;
          case 4:
            ref_cell = ref_grid_tet(ref_grid);
            break;
          case 5:
            ref_cell = ref_grid_hex(ref_grid);
            break;
          case 6:
            ref_cell = ref_grid_pri(ref_grid);
            break;
          case 7:
            ref_cell = ref_grid_pyr(ref_grid);
            break;
          case 8:
            ref_cell = ref_grid_ed2(ref_grid);
            break;
          case 9:
            ref_cell = ref_grid_tr2(ref_grid);
            break;
          case 11:
            ref_cell = ref_grid_te2(ref_grid);
            break;
          case 21:
            ref_cell = ref_grid_tr3(ref_grid);
            break;
          case 26:
            ref_cell = ref_grid_ed3(ref_grid);
            break;
          default:
            printf("type = %d\n", type);
            THROW("unknown $Elements type");
        }
        for (i = 0; i < n; i++) {
          REF_INT cell_node, tag;
          REIS(1, fscanf(file, "%d", &tag), "elementTag(size_t)");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            REIS(1, fscanf(file, "%d", &(nodes[cell_node])), "nodeTag(size_t)");
            (nodes[cell_node])--;
          }
          if (ref_cell_last_node_is_an_id(ref_cell))
            nodes[ref_cell_id_index(ref_cell)] = tag;
          if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
            n0 = nodes[0];
            n1 = nodes[1];
            n2 = nodes[2];
            n3 = nodes[3];
            n4 = nodes[4];
            nodes[0] = n0;
            nodes[1] = n3;
            nodes[2] = n4;
            nodes[3] = n1;
            nodes[4] = n2;
          }
          if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
            n9 = nodes[9];
            nodes[9] = nodes[8];
            nodes[8] = n9;
          }
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add $Element");
        }
      }
    }
  }

  fclose(file);

  return REF_IMPLEMENT;
}